

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O0

bool __thiscall
Ptex::v2_2::PtexReader::readBlock(PtexReader *this,void *data,int size,bool reporterror)

{
  int iVar1;
  byte in_CL;
  int in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  int result;
  undefined3 in_stack_00000018;
  undefined1 local_1;
  
  if ((*(long *)(in_RDI + 0x58) == 0) || (in_EDX < 0)) {
    local_1 = false;
  }
  else {
    iVar1 = (**(code **)(**(long **)(in_RDI + 0x40) + 0x20))
                      (*(long **)(in_RDI + 0x40),in_RSI,(long)in_EDX,*(undefined8 *)(in_RDI + 0x58))
    ;
    if (iVar1 == in_EDX) {
      *(long *)(in_RDI + 0x60) = (long)in_EDX + *(long *)(in_RDI + 0x60);
      local_1 = true;
    }
    else {
      if ((in_CL & 1) != 0) {
        setError((PtexReader *)data,(char *)CONCAT44(size,_in_stack_00000018));
      }
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool PtexReader::readBlock(void* data, int size, bool reporterror)
{
    assert(_fp && size >= 0);
    if (!_fp || size < 0) return false;
    int result = (int)_io->read(data, size, _fp);
    if (result == size) {
        _pos += size;
        return true;
    }
    if (reporterror)
        setError("PtexReader error: read failed (EOF)");
    return false;
}